

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O1

void __thiscall pg::FPJSolver::runSeqGreedy(FPJSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  char cVar5;
  void *pvVar6;
  void *__s;
  uint *__s_00;
  void *pvVar7;
  long lVar8;
  ostream *poVar9;
  long *plVar10;
  Game *pGVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  int from;
  uint uVar15;
  undefined4 uVar16;
  ulong uVar17;
  ulong uVar18;
  uint *puVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int local_7c;
  _label_vertex local_58;
  void *local_48;
  void *local_40;
  long local_38;
  
  pGVar11 = (this->super_Solver).game;
  pvVar6 = operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                          pGVar11->n_vertices << 2);
  uVar25 = pGVar11->n_vertices + 0x3f;
  uVar24 = uVar25 >> 3 & 0xfffffffffffffff8;
  local_48 = operator_new__(uVar24);
  if (0x3f < uVar25) {
    memset(local_48,0,uVar24);
  }
  uVar24 = pGVar11->n_vertices + 0x3f;
  uVar25 = uVar24 >> 3 & 0x1ffffffffffffff8;
  __s = operator_new__(uVar25);
  if (0x3f < uVar24) {
    memset(__s,0,uVar25);
  }
  uVar24 = pGVar11->n_vertices + 0x3f;
  uVar25 = uVar24 >> 3 & 0x1ffffffffffffff8;
  __s_00 = (uint *)operator_new__(uVar25);
  if (0x3f < uVar24) {
    memset(__s_00,0,uVar25);
  }
  uVar24 = pGVar11->n_vertices;
  if (0 < (long)uVar24) {
    piVar3 = pGVar11->_priority;
    uVar25 = 0;
    do {
      uVar24 = uVar25 >> 6;
      uVar18 = 1L << (uVar25 & 0x3f);
      if ((*(byte *)(piVar3 + uVar25) & 1) == 0) {
        uVar18 = ~uVar18 & *(ulong *)(__s_00 + uVar24 * 2);
      }
      else {
        uVar18 = uVar18 | *(ulong *)(__s_00 + uVar24 * 2);
      }
      *(ulong *)(__s_00 + uVar24 * 2) = uVar18;
      uVar25 = uVar25 + 1;
      uVar24 = pGVar11->n_vertices;
    } while ((long)uVar25 < (long)uVar24);
  }
  pvVar7 = operator_new__((uVar24 & 0xffffffff) << 2);
  uVar23 = *__s_00 & 1;
  local_7c = 0;
  uVar15 = 0;
  bVar13 = false;
  local_40 = pvVar7;
  do {
    uVar24 = (ulong)(int)uVar15;
    if (((this->super_Solver).game)->n_vertices == uVar24) {
LAB_0015aaf3:
      if (bVar13) {
        while (local_7c != 0) {
          lVar8 = (long)local_7c;
          local_7c = local_7c + -1;
          local_38 = (long)*(int *)((long)pvVar7 + lVar8 * 4 + -4);
          pGVar11 = (this->super_Solver).game;
          piVar3 = pGVar11->_inedges;
          lVar8 = (long)pGVar11->_firstins[local_38];
          uVar14 = piVar3[lVar8];
          if (uVar14 != 0xffffffff) {
            puVar19 = (uint *)(piVar3 + lVar8 + 1);
            do {
              uVar24 = (ulong)(long)(int)uVar14 >> 6;
              if (((*(ulong *)((long)local_48 + uVar24 * 8) >> ((ulong)uVar14 & 0x3f) & 1) != 0) &&
                 ((iVar20 = *(int *)((long)pvVar6 + (long)(int)uVar14 * 4), iVar20 == -1 ||
                  (iVar20 == (int)local_38)))) {
                if (1 < (this->super_Solver).trace) {
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"\x1b[31;1mresetting\x1b[m ",0x14);
                  local_58.g = (this->super_Solver).game;
                  local_58.v = uVar14;
                  poVar9 = operator<<(poVar9,&local_58);
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                  pvVar7 = local_40;
                }
                uVar25 = ~(1L << ((ulong)uVar14 & 0x3f));
                puVar1 = (ulong *)((long)local_48 + uVar24 * 8);
                *puVar1 = *puVar1 & uVar25;
                puVar1 = (ulong *)((long)__s + uVar24 * 8);
                *puVar1 = *puVar1 & uVar25;
                lVar8 = (long)local_7c;
                local_7c = local_7c + 1;
                *(uint *)((long)pvVar7 + lVar8 * 4) = uVar14;
                if ((int)uVar14 < (int)uVar15) {
                  uVar15 = uVar14;
                }
              }
              uVar14 = *puVar19;
              puVar19 = puVar19 + 1;
            } while (uVar14 != 0xffffffff);
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"restarting after finding distractions of prio ",0x2e);
          plVar10 = (long *)std::ostream::operator<<
                                      (poVar9,((this->super_Solver).game)->_priority
                                              [(long)(int)uVar15 + -1]);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
        }
        this->iterations = this->iterations + 1;
        bVar13 = false;
      }
      uVar24 = (ulong)(int)uVar15;
      bVar4 = true;
      if (((this->super_Solver).game)->n_vertices != uVar24) {
        uVar23 = (uint)((*(ulong *)(__s_00 + (uVar24 >> 6) * 2) >> (uVar24 & 0x3f) & 1) != 0);
LAB_0015ad2c:
        uVar18 = (ulong)(int)uVar15;
        uVar25 = uVar18 >> 6;
        uVar24 = *(ulong *)((long)local_48 + uVar25 * 8);
        if ((uVar24 >> (uVar18 & 0x3f) & 1) == 0) {
          uVar12 = 1L << (uVar18 & 0x3f);
          *(ulong *)((long)local_48 + uVar25 * 8) = uVar24 | uVar12;
          pGVar11 = (this->super_Solver).game;
          piVar3 = pGVar11->_outedges;
          lVar8 = (long)pGVar11->_firstouts[uVar18];
          uVar14 = piVar3[lVar8];
          uVar24 = (ulong)uVar14;
          if (((pGVar11->_owner)._bits[uVar25] & uVar12) == 0) {
            if (uVar14 == 0xffffffff) {
              uVar14 = 1;
              goto LAB_0015aedc;
            }
            puVar19 = (uint *)(piVar3 + lVar8 + 1);
            uVar17 = 0xffffffff;
            uVar14 = 1;
            do {
              uVar22 = (ulong)(long)(int)uVar24 >> 6;
              iVar20 = 0xe;
              if ((((this->super_Solver).disabled)->_bits[uVar22] >> (uVar24 & 0x3f) & 1) == 0) {
                uVar21 = 1L << (uVar24 & 0x3f);
                bVar4 = ((*(ulong *)((long)__s + uVar22 * 8) & uVar21) != 0) ==
                        ((*(ulong *)(__s_00 + uVar22 * 2) & uVar21) != 0);
                if (bVar4) {
                  uVar17 = uVar24;
                }
                if (bVar4) {
                  uVar14 = 0;
                }
                iVar20 = 0xc;
                if (!bVar4) {
                  iVar20 = 0;
                }
              }
              uVar16 = (undefined4)uVar17;
              if ((iVar20 != 0xe) && (iVar20 != 0)) break;
              uVar2 = *puVar19;
              uVar24 = (ulong)uVar2;
              puVar19 = puVar19 + 1;
            } while (uVar2 != 0xffffffff);
          }
          else if (uVar14 == 0xffffffff) {
            uVar14 = 0;
LAB_0015aedc:
            uVar16 = 0xffffffff;
          }
          else {
            puVar19 = (uint *)(piVar3 + lVar8 + 1);
            uVar17 = 0xffffffff;
            uVar14 = 0;
            do {
              uVar22 = (ulong)(long)(int)uVar24 >> 6;
              iVar20 = 0x11;
              if ((((this->super_Solver).disabled)->_bits[uVar22] >> (uVar24 & 0x3f) & 1) == 0) {
                uVar21 = 1L << (uVar24 & 0x3f);
                bVar4 = ((*(ulong *)((long)__s + uVar22 * 8) & uVar21) != 0) !=
                        ((*(ulong *)(__s_00 + uVar22 * 2) & uVar21) != 0);
                if (bVar4) {
                  uVar14 = 1;
                  uVar17 = uVar24;
                }
                iVar20 = 0;
                if (bVar4) {
                  iVar20 = 0xf;
                }
              }
              uVar16 = (undefined4)uVar17;
              if ((iVar20 != 0x11) && (iVar20 != 0)) break;
              uVar2 = *puVar19;
              uVar24 = (ulong)uVar2;
              puVar19 = puVar19 + 1;
            } while (uVar2 != 0xffffffff);
          }
          *(undefined4 *)((long)pvVar6 + uVar18 * 4) = uVar16;
          if (uVar23 == uVar14) {
            if (1 < (this->super_Solver).trace) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\x1b[38;5;165;1mjustified\x1b[m ",0x1a);
              local_58.g = (this->super_Solver).game;
              local_58.v = uVar15;
              operator<<(poVar9,&local_58);
              if (*(int *)((long)pvVar6 + uVar18 * 4) != -1) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," => ",4);
                local_58.v = *(uint *)((long)pvVar6 + uVar18 * 4);
                local_58.g = (this->super_Solver).game;
                operator<<(poVar9,&local_58);
              }
              poVar9 = (this->super_Solver).logger;
              cVar5 = (char)poVar9;
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
            }
          }
          else {
            lVar8 = (long)local_7c;
            local_7c = local_7c + 1;
            *(uint *)((long)pvVar7 + lVar8 * 4) = uVar15;
            puVar1 = (ulong *)((long)__s + uVar25 * 8);
            *puVar1 = *puVar1 | uVar12;
            bVar13 = true;
            if (1 < (this->super_Solver).trace) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\x1b[38;5;165;1mjustified*\x1b[m ",0x1b);
              local_58.g = (this->super_Solver).game;
              local_58.v = uVar15;
              operator<<(poVar9,&local_58);
              if (*(int *)((long)pvVar6 + uVar18 * 4) != -1) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," => ",4);
                local_58.v = *(uint *)((long)pvVar6 + uVar18 * 4);
                local_58.g = (this->super_Solver).game;
                operator<<(poVar9,&local_58);
              }
              poVar9 = (this->super_Solver).logger;
              cVar5 = (char)poVar9;
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              bVar13 = true;
            }
          }
        }
        uVar15 = uVar15 + 1;
        bVar4 = false;
      }
    }
    else {
      if ((((this->super_Solver).disabled)->_bits[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) {
        if (uVar23 != ((*(ulong *)(__s_00 + (uVar24 >> 6) * 2) & 1L << (uVar24 & 0x3f)) != 0))
        goto LAB_0015aaf3;
        goto LAB_0015ad2c;
      }
      uVar15 = uVar15 + 1;
      bVar4 = false;
    }
    if (bVar4) {
      pGVar11 = (this->super_Solver).game;
      if (0 < pGVar11->n_vertices) {
        uVar24 = 0;
        do {
          uVar25 = uVar24 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar25] >> (uVar24 & 0x3f) & 1) == 0) {
            uVar18 = 1L << (uVar24 & 0x3f);
            bVar13 = ((*(ulong *)((long)__s + uVar25 * 8) & uVar18) != 0) !=
                     ((*(ulong *)(__s_00 + uVar25 * 2) & uVar18) != 0);
            iVar20 = -1;
            if (bVar13 != (((pGVar11->_owner)._bits[uVar25] >> (uVar24 & 0x3f) & 1) == 0)) {
              iVar20 = *(int *)((long)pvVar6 + uVar24 * 4);
            }
            Oink::solve((this->super_Solver).oink,(int)uVar24,(uint)bVar13,iVar20);
          }
          uVar24 = uVar24 + 1;
          pGVar11 = (this->super_Solver).game;
        } while ((long)uVar24 < pGVar11->n_vertices);
      }
      operator_delete__(pvVar6);
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solved with ",0xc);
      poVar9 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," iterations.",0xc);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      operator_delete__(pvVar7);
      operator_delete__(__s_00);
      operator_delete__(__s);
      operator_delete__(local_48);
      return;
    }
  } while( true );
}

Assistant:

void
FPJSolver::runSeqGreedy()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) { i++; continue; }
        justified[i] = true;

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        } else {
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}